

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationIndex.cpp
# Opt level: O3

unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
 __thiscall VariationIndex::_getInsertions(VariationIndex *this,int chromosome_id,size_t position)

{
  ulong uVar1;
  iterator __position;
  node_pointer ppVar2;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  iVar3;
  ulong uVar4;
  pointer __p;
  ulong in_RCX;
  long lVar5;
  undefined4 in_register_00000034;
  long lVar6;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  emplace_return eVar7;
  int local_34;
  
  lVar6 = CONCAT44(in_register_00000034,chromosome_id);
  ppVar2 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
           ::find_node_impl<int,std::equal_to<int>>
                     ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
                       *)(lVar6 + 0x10),(long)(int)position,&local_34,
                      (equal_to<int> *)((ulong)(*(byte *)(lVar6 + 0x10) & 1) + lVar6 + 0x11));
  if (ppVar2 == (node_pointer)0x0) {
    this->_vptr_VariationIndex = (_func_int **)0x0;
  }
  else {
    eVar7 = boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
            ::try_emplace_unique<int_const&>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
                        *)(lVar6 + 0x10),&local_34);
    iVar3 = eVar7.first.node_;
    uVar4 = (in_RCX - 1) / *(ulong *)(lVar6 + 0x78);
    lVar6 = *(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 0x20);
    lVar5 = *(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 0x28);
    this->_vptr_VariationIndex = (_func_int **)0x0;
    if (uVar4 < (ulong)(lVar5 - lVar6 >> 5)) {
      uVar4 = *(ulong *)(lVar6 + uVar4 * 0x20);
      lVar6 = *(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 8);
      if (uVar4 < (ulong)((*(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 0x10) - lVar6
                          >> 3) * -0x5555555555555555)) {
        lVar5 = uVar4 * 0x18 + 8;
        do {
          uVar1 = *(ulong *)(lVar6 + -8 + lVar5);
          if (in_RCX < uVar1) {
            return (__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
                      )this;
          }
          if ((uVar1 == in_RCX) && (*(int *)(lVar6 + 8 + lVar5) == 0)) {
            this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                      this->_vptr_VariationIndex;
            if (this_00 == (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0) {
              __p = (pointer)operator_new(0x18);
              (__p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (__p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (__p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::reset((__uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)this,__p);
              this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                        this->_vptr_VariationIndex;
            }
            __position._M_current = *(unsigned_long **)(this_00 + 8);
            if (__position._M_current == *(unsigned_long **)(this_00 + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        (this_00,__position,(unsigned_long *)(lVar6 + lVar5));
            }
            else {
              *__position._M_current = *(unsigned_long *)(lVar6 + lVar5);
              *(unsigned_long **)(this_00 + 8) = __position._M_current + 1;
            }
          }
          uVar4 = uVar4 + 1;
          lVar6 = *(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 8);
          lVar5 = lVar5 + 0x18;
        } while (uVar4 < (ulong)((*(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 0x10)
                                  - lVar6 >> 3) * -0x5555555555555555));
      }
    }
  }
  return (__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::vector<size_t> > VariationIndex::_getInsertions(int chromosome_id, size_t position) {
	if (chromosomes.find(chromosome_id) == chromosomes.end()) {
		return unique_ptr<vector<size_t> >(nullptr);
	}
	const chromosome_record_t& chromosome_record = chromosomes[chromosome_id];
	size_t k = (position-1) / step_size;
	if (chromosome_record.checkpoint_list.size() <= k) {
		return unique_ptr<vector<size_t> >(nullptr);
	}
	const vector<event_t>& event_list = chromosome_record.events;
	unique_ptr<vector<size_t> > result(nullptr);
	for (size_t i=chromosome_record.checkpoint_list[k].index; i<event_list.size(); ++i) {
		const event_t& event = event_list[i];
		if (event.position > position) break;
		if ((event.position == position) && (event.type == INSERTION)) {
			if (result.get() == 0) {
				result = unique_ptr<vector<size_t> >(new vector<size_t>());
			}
			result->push_back(event.variation_index);
		}
	}
	return result;
}